

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
          (EpsCopyOutputStream *this,void *data,int size,uint8 *ptr)

{
  int iVar1;
  size_t __n;
  
  while( true ) {
    iVar1 = ((int)this->end_ - (int)ptr) + 0x10;
    if (size - iVar1 == 0 || size < iVar1) break;
    __n = (size_t)iVar1;
    memcpy(ptr,data,__n);
    data = (void *)((long)data + __n);
    ptr = EnsureSpaceFallback(this,ptr + __n);
    size = size - iVar1;
  }
  memcpy(ptr,data,(long)size);
  return ptr + size;
}

Assistant:

uint8* EpsCopyOutputStream::WriteRawFallback(const void* data, int size,
                                             uint8* ptr) {
  int s = GetSize(ptr);
  while (s < size) {
    std::memcpy(ptr, data, s);
    size -= s;
    data = static_cast<const uint8*>(data) + s;
    ptr = EnsureSpaceFallback(ptr + s);
    s = GetSize(ptr);
  }
  std::memcpy(ptr, data, size);
  return ptr + size;
}